

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O0

int Ssw_ManSweepResimulateDynLocal(Ssw_Man_t *p,int f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  bool local_6d;
  abctime clk;
  int RetValue2;
  int RetValue1;
  int nSize;
  int k;
  int i;
  Aig_Obj_t **ppClass;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Ssw_Man_t *pSStack_10;
  int f_local;
  Ssw_Man_t *p_local;
  
  pObj._4_4_ = f;
  pSStack_10 = p;
  aVar4 = Abc_Clock();
  pSStack_10->nSimRounds = pSStack_10->nSimRounds + 1;
  Ssw_ManSweepTransferDyn(pSStack_10);
  Vec_PtrClear(pSStack_10->vResimConsts);
  Vec_PtrClear(pSStack_10->vResimClasses);
  Aig_ManIncrementTravId(pSStack_10->pAig);
  for (nSize = pSStack_10->iNodeStart;
      (iVar2 = nSize, nSize < pSStack_10->iNodeLast + pSStack_10->pPars->nResimDelta &&
      (iVar1 = Aig_ManObjNumMax(pSStack_10->pAig), iVar2 < iVar1)); nSize = nSize + 1) {
    pRepr = Aig_ManObj(pSStack_10->pAig,nSize);
    if (pRepr != (Aig_Obj_t *)0x0) {
      iVar2 = Ssw_ObjIsConst1Cand(pSStack_10->pAig,pRepr);
      if (iVar2 == 0) {
        ppClass = (Aig_Obj_t **)Aig_ObjRepr(pSStack_10->pAig,pRepr);
        if (((Aig_Obj_t *)ppClass != (Aig_Obj_t *)0x0) &&
           (iVar2 = Aig_ObjIsTravIdCurrent(pSStack_10->pAig,(Aig_Obj_t *)ppClass), iVar2 == 0)) {
          Aig_ObjSetTravIdCurrent(pSStack_10->pAig,(Aig_Obj_t *)ppClass);
          Vec_PtrPush(pSStack_10->vResimClasses,ppClass);
        }
      }
      else {
        Vec_PtrPush(pSStack_10->vResimConsts,pRepr);
      }
    }
  }
  pSStack_10->nVisCounter = pSStack_10->nVisCounter + 1;
  for (nSize = 0; iVar2 = nSize, iVar1 = Vec_PtrSize(pSStack_10->vResimConsts), iVar2 < iVar1;
      nSize = nSize + 1) {
    pRepr = (Aig_Obj_t *)Vec_PtrEntry(pSStack_10->vResimConsts,nSize);
    Ssw_SmlSimulateOneDyn_rec
              (pSStack_10->pSml,pRepr,pSStack_10->nFrames + -1,pSStack_10->pVisited,
               pSStack_10->nVisCounter);
  }
  for (nSize = 0; iVar2 = nSize, iVar1 = Vec_PtrSize(pSStack_10->vResimClasses), iVar2 < iVar1;
      nSize = nSize + 1) {
    ppClass = (Aig_Obj_t **)Vec_PtrEntry(pSStack_10->vResimClasses,nSize);
    _k = Ssw_ClassesReadClass(pSStack_10->ppClasses,(Aig_Obj_t *)ppClass,&RetValue2);
    for (RetValue1 = 0; RetValue1 < RetValue2; RetValue1 = RetValue1 + 1) {
      Ssw_SmlSimulateOneDyn_rec
                (pSStack_10->pSml,_k[RetValue1],pSStack_10->nFrames + -1,pSStack_10->pVisited,
                 pSStack_10->nVisCounter);
    }
  }
  iVar2 = Ssw_ClassesRefineConst1Group(pSStack_10->ppClasses,pSStack_10->vResimConsts,1);
  clk._4_4_ = 0;
  for (nSize = 0; iVar1 = nSize, iVar3 = Vec_PtrSize(pSStack_10->vResimClasses), iVar1 < iVar3;
      nSize = nSize + 1) {
    ppClass = (Aig_Obj_t **)Vec_PtrEntry(pSStack_10->vResimClasses,nSize);
    iVar1 = Ssw_ClassesRefineOneClass(pSStack_10->ppClasses,(Aig_Obj_t *)ppClass,1);
    clk._4_4_ = iVar1 + clk._4_4_;
  }
  Vec_PtrCleanSimInfo(pSStack_10->vSimInfo,0,1);
  pSStack_10->nPatterns = 0;
  pSStack_10->nSimRounds = pSStack_10->nSimRounds + 1;
  aVar5 = Abc_Clock();
  pSStack_10->timeSimSat = (aVar5 - aVar4) + pSStack_10->timeSimSat;
  local_6d = 0 < iVar2 || 0 < clk._4_4_;
  return (int)local_6d;
}

Assistant:

int Ssw_ManSweepResimulateDynLocal( Ssw_Man_t * p, int f )
{
    Aig_Obj_t * pObj, * pRepr, ** ppClass;
    int i, k, nSize, RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    p->nSimRounds++;
    // transfer PI simulation information from storage
//    Ssw_SmlAssignDist1Plus( p->pSml, p->pPatWords );
    Ssw_ManSweepTransferDyn( p );
    // determine const1 cands and classes to be simulated
    Vec_PtrClear( p->vResimConsts );
    Vec_PtrClear( p->vResimClasses );
    Aig_ManIncrementTravId( p->pAig );
    for ( i = p->iNodeStart; i < p->iNodeLast + p->pPars->nResimDelta; i++ )
    {
        if ( i >= Aig_ManObjNumMax( p->pAig ) )
            break;
        pObj = Aig_ManObj( p->pAig, i );
        if ( pObj == NULL )
            continue;
        if ( Ssw_ObjIsConst1Cand(p->pAig, pObj) )
        {
            Vec_PtrPush( p->vResimConsts, pObj );
            continue;
        }
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p->pAig, pRepr) )
            continue;
        Aig_ObjSetTravIdCurrent(p->pAig, pRepr);
        Vec_PtrPush( p->vResimClasses, pRepr );
    }
    // simulate internal nodes
//    Ssw_SmlSimulateOneFrame( p->pSml );
//    Ssw_SmlSimulateOne( p->pSml );
    // resimulate dynamically
//    Aig_ManIncrementTravId( p->pAig );
//    Aig_ObjIsTravIdCurrent( p->pAig, Aig_ManConst1(p->pAig) );
    p->nVisCounter++;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimConsts, pObj, i )
        Ssw_SmlSimulateOneDyn_rec( p->pSml, pObj, p->nFrames-1, p->pVisited, p->nVisCounter );
    // resimulate the cone of influence of the cand classes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimClasses, pRepr, i )
    {
        ppClass = Ssw_ClassesReadClass( p->ppClasses, pRepr, &nSize );
        for ( k = 0; k < nSize; k++ )
            Ssw_SmlSimulateOneDyn_rec( p->pSml, ppClass[k], p->nFrames-1, p->pVisited, p->nVisCounter );
    }

    // check equivalence classes
//    RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 1 );
//    RetValue2 = Ssw_ClassesRefine( p->ppClasses, 1 );
    // refine these nodes
    RetValue1 = Ssw_ClassesRefineConst1Group( p->ppClasses, p->vResimConsts, 1 );
    RetValue2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimClasses, pRepr, i )
        RetValue2 += Ssw_ClassesRefineOneClass( p->ppClasses, pRepr, 1 );

    // prepare simulation info for the next round
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );
    p->nPatterns = 0;
    p->nSimRounds++;
p->timeSimSat += Abc_Clock() - clk;
    return RetValue1 > 0 || RetValue2 > 0;
}